

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_synth.cpp
# Opt level: O2

void __thiscall Group::update_labels(Group *this)

{
  char buf [32];
  allocator<char> local_81;
  float local_80;
  float local_7c;
  string local_78;
  string local_58;
  char local_38 [40];
  
  local_7c = get_frequency(this);
  local_80 = get_phase(this);
  sprintf(local_38,"%4.0f Hz",(double)local_7c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,local_38,&local_81);
  Label::set_text(&this->freq_val_label,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  sprintf(local_38,anon_var_dwarf_191,(double)local_80 / 3.141592653589793);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,local_38,&local_81);
  Label::set_text(&this->phase_val_label,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void Group::update_labels()
{
   char buf[32];
   float frequency = get_frequency();
   float phase = get_phase();

   sprintf(buf, "%4.0f Hz", frequency);
   freq_val_label.set_text(buf);

   sprintf(buf, "%.2f π", phase/PI);
   phase_val_label.set_text(buf);
}